

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O0

bool cppcms::encoding::windows_1252_valid<char_const*>(char *p,char *e,size_t *count)

{
  uint uVar1;
  char *pcVar2;
  uint c;
  size_t *count_local;
  char *e_local;
  char *p_local;
  
  p_local = p;
  while( true ) {
    do {
      if (p_local == e) {
        return true;
      }
      *count = *count + 1;
      pcVar2 = p_local + 1;
      uVar1 = (uint)(byte)*p_local;
      p_local = pcVar2;
    } while (((uVar1 == 9) || (uVar1 == 10)) || (uVar1 == 0xd));
    if ((uVar1 < 0x20) || (uVar1 == 0x7f)) break;
    if (((uVar1 == 0x81) || (uVar1 == 0x8d)) || ((uVar1 - 0x8f < 2 || (uVar1 == 0x9d)))) {
      return false;
    }
  }
  return false;
}

Assistant:

bool windows_1252_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || 0x7F==c)
				return false;
			switch(c) {
			case 0x81:
			case 0x8D:
			case 0x8F:
			case 0x90:
			case 0x9D:
				return false;
			}
		}
		return true;
	}